

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr
          (DebugInfoManager *this,Instruction *dbg_declare,Instruction *scope)

{
  pointer puVar1;
  bool bVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  Instruction *pIVar4;
  iterator iVar5;
  uint32_t i;
  uint32_t uVar6;
  pointer puVar7;
  uint32_t dbg_local_var_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> scope_ids;
  
  if (dbg_declare == (Instruction *)0x0) {
    __assert_fail("dbg_declare != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x20f,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  if (scope == (Instruction *)0x0) {
    __assert_fail("scope != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x210,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (scope->opcode_ == OpPhi) {
    dbg_local_var_id = (scope->dbg_scope_).lexical_scope_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&scope_ids,&dbg_local_var_id);
    uVar6 = 0;
    while( true ) {
      uVar3 = Instruction::NumInOperands(scope);
      if (uVar3 <= uVar6) break;
      this_00 = IRContext::get_def_use_mgr(this->context_);
      uVar3 = Instruction::GetSingleWordInOperand(scope,uVar6);
      pIVar4 = DefUseManager::GetDef(this_00,uVar3);
      if (pIVar4 != (Instruction *)0x0) {
        dbg_local_var_id = (pIVar4->dbg_scope_).lexical_scope_;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&scope_ids,&dbg_local_var_id);
      }
      uVar6 = uVar6 + 2;
    }
  }
  else {
    dbg_local_var_id = (scope->dbg_scope_).lexical_scope_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&scope_ids,&dbg_local_var_id);
  }
  dbg_local_var_id = Instruction::GetSingleWordOperand(dbg_declare,4);
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->id_to_dbg_inst_)._M_h,&dbg_local_var_id);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    __assert_fail("dbg_local_var_itr != id_to_dbg_inst_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x222,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  uVar6 = Instruction::GetSingleWordOperand
                    (*(Instruction **)
                      ((long)iVar5.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                             ._M_cur + 0x10),9);
  puVar1 = scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar7 = scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    if (*puVar7 != 0) {
      bVar2 = IsAncestorOfScope(this,*puVar7,uVar6);
      if (bVar2) break;
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&scope_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return puVar7 != puVar1;
}

Assistant:

bool DebugInfoManager::IsDeclareVisibleToInstr(Instruction* dbg_declare,
                                               Instruction* scope) {
  assert(dbg_declare != nullptr);
  assert(scope != nullptr);

  std::vector<uint32_t> scope_ids;
  if (scope->opcode() == spv::Op::OpPhi) {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
    for (uint32_t i = 0; i < scope->NumInOperands(); i += 2) {
      auto* value = context()->get_def_use_mgr()->GetDef(
          scope->GetSingleWordInOperand(i));
      if (value != nullptr)
        scope_ids.push_back(value->GetDebugScope().GetLexicalScope());
    }
  } else {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
  }

  uint32_t dbg_local_var_id =
      dbg_declare->GetSingleWordOperand(kDebugDeclareOperandLocalVariableIndex);
  auto dbg_local_var_itr = id_to_dbg_inst_.find(dbg_local_var_id);
  assert(dbg_local_var_itr != id_to_dbg_inst_.end());
  uint32_t decl_scope_id = dbg_local_var_itr->second->GetSingleWordOperand(
      kDebugLocalVariableOperandParentIndex);

  // If the scope of DebugDeclare is an ancestor scope of the instruction's
  // scope, the local variable is visible to the instruction.
  for (uint32_t scope_id : scope_ids) {
    if (scope_id != kNoDebugScope &&
        IsAncestorOfScope(scope_id, decl_scope_id)) {
      return true;
    }
  }
  return false;
}